

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
::disposeImpl(DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
              *this,void *pointer)

{
  if ((this->
      super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
      ).first.ptr != (DestructionOrderRecorder *)0x0) {
    (this->
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    ).first.ptr = (DestructionOrderRecorder *)0x0;
    (**((this->
        super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
        ).first.disposer)->_vptr_Disposer)();
  }
  if ((this->
      super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
      ).super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>.first.ptr
      != (DestructionOrderRecorder *)0x0) {
    (this->
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    ).super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>.first.ptr =
         (DestructionOrderRecorder *)0x0;
    (**((this->
        super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
        ).super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>.first.
       disposer)->_vptr_Disposer)();
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }